

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O1

void X86_ATT_printInst(MCInst *MI,SStream *OS,void *info)

{
  uint8_t *puVar1;
  char cVar2;
  byte bVar3;
  cs_struct *h;
  anon_union_1768_13_9c5aee68_for_cs_detail_6 *paVar4;
  _Bool _Var5;
  uint uVar6;
  x86_reg xVar7;
  MCOperand *pMVar8;
  int64_t iVar9;
  MCRegisterClass *c;
  cs_detail *pcVar10;
  long lVar11;
  ulong uVar12;
  SStream *O;
  MCRegisterInfo *extraout_RDX;
  MCRegisterInfo *extraout_RDX_00;
  MCRegisterInfo *extraout_RDX_01;
  MCRegisterInfo *extraout_RDX_02;
  MCRegisterInfo *extraout_RDX_03;
  MCRegisterInfo *extraout_RDX_04;
  MCRegisterInfo *extraout_RDX_05;
  MCRegisterInfo *extraout_RDX_06;
  MCRegisterInfo *extraout_RDX_07;
  MCRegisterInfo *extraout_RDX_08;
  MCRegisterInfo *extraout_RDX_09;
  ulong uVar13;
  MCRegisterInfo *extraout_RDX_10;
  MCRegisterInfo *extraout_RDX_11;
  MCRegisterInfo *extraout_RDX_12;
  MCRegisterInfo *extraout_RDX_13;
  MCRegisterInfo *pMVar14;
  MCRegisterInfo *extraout_RDX_14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  cs_ac_type access1;
  x86_reg reg;
  uint8_t access [6];
  cs_ac_type access2;
  x86_reg reg2;
  undefined1 local_48 [4];
  x86_reg local_44;
  uint8_t local_40 [8];
  undefined1 local_38 [4];
  x86_reg local_34;
  
  if (MI->assembly[0] != '\0') {
    strncpy(OS->buffer,MI->assembly,0x200);
    return;
  }
  if ((MI->csh->mode == CS_MODE_64) && (uVar6 = MCInst_getOpcode(MI), uVar6 == 0x169)) {
    SStream_concat0(OS,"callq\t");
    MCInst_setOpcodePub(MI,0x38);
    printPCRelImm(MI,(uint)OS,O);
    return;
  }
  uVar6 = MCInst_getOpcode(MI);
  pcVar17 = (char *)0x0;
  pMVar14 = extraout_RDX;
  if ((int)uVar6 < 0x272) {
    if (uVar6 == 0x17) {
      uVar6 = MCInst_getNumOperands(MI);
      pMVar14 = extraout_RDX_04;
      if (uVar6 == 1) {
        pcVar17 = (char *)0x0;
        pMVar8 = MCInst_getOperand(MI,0);
        _Var5 = MCOperand_isImm(pMVar8);
        pMVar14 = extraout_RDX_05;
        if (_Var5) {
          pcVar17 = (char *)0x0;
          pMVar8 = MCInst_getOperand(MI,0);
          iVar9 = MCOperand_getImm(pMVar8);
          pMVar14 = extraout_RDX_06;
          if (iVar9 == 10) {
            pcVar17 = "aad";
            goto LAB_001d4f37;
          }
        }
      }
      else {
LAB_001d4f66:
        pcVar17 = (char *)0x0;
      }
    }
    else {
      pcVar17 = (char *)0x0;
      if (uVar6 == 0x18) {
        uVar6 = MCInst_getNumOperands(MI);
        pMVar14 = extraout_RDX_00;
        if (uVar6 != 1) goto LAB_001d4f66;
        pcVar17 = (char *)0x0;
        pMVar8 = MCInst_getOperand(MI,0);
        _Var5 = MCOperand_isImm(pMVar8);
        pMVar14 = extraout_RDX_01;
        if (_Var5) {
          pcVar17 = (char *)0x0;
          pMVar8 = MCInst_getOperand(MI,0);
          iVar9 = MCOperand_getImm(pMVar8);
          pMVar14 = extraout_RDX_02;
          if (iVar9 == 10) {
            pcVar17 = "aam";
            goto LAB_001d4f37;
          }
        }
      }
    }
  }
  else if (uVar6 == 0x272) {
    uVar6 = MCInst_getNumOperands(MI);
    pMVar14 = extraout_RDX_07;
    if (uVar6 != 6) goto LAB_001d4f66;
    pcVar17 = (char *)0x0;
    pMVar8 = MCInst_getOperand(MI,0);
    _Var5 = MCOperand_isReg(pMVar8);
    pMVar14 = extraout_RDX_08;
    if (_Var5) {
      c = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,0x2a);
      pcVar17 = (char *)0x0;
      pMVar8 = MCInst_getOperand(MI,0);
      uVar6 = MCOperand_getReg(pMVar8);
      _Var5 = MCRegisterClass_contains(c,uVar6);
      pMVar14 = extraout_RDX_09;
      if (_Var5) {
        pcVar17 = anon_var_dwarf_2d5950;
        goto LAB_001d4f37;
      }
    }
  }
  else if (uVar6 == 0x2291) {
    uVar6 = MCInst_getNumOperands(MI);
    pMVar14 = extraout_RDX_03;
    if (uVar6 != 0) goto LAB_001d4f66;
    pcVar17 = "xstorerng";
LAB_001d4f37:
    pcVar17 = cs_strdup(pcVar17);
    for (pcVar15 = pcVar17; cVar2 = *pcVar15, cVar2 != '\0'; pcVar15 = pcVar15 + 1) {
      if ((cVar2 == ' ') || (cVar2 == '\t')) {
        *pcVar15 = '\0';
        pcVar15 = pcVar15 + 1;
        break;
      }
    }
    SStream_concat0(OS,pcVar17);
    pMVar14 = extraout_RDX_10;
    if (*pcVar15 != '\0') {
      SStream_concat0(OS,anon_var_dwarf_36505f + 0x11);
      pMVar14 = extraout_RDX_11;
      do {
        cVar2 = *pcVar15;
        if (cVar2 == '$') {
          if (pcVar15[1] == -1) {
            pcVar16 = pcVar15 + 3;
            if (pcVar15[3] == '\x01') {
              cVar2 = pcVar15[2];
              MI->x86opsize = '\b';
              printMemReference(MI,(int)cVar2 - 1,OS);
              pMVar14 = extraout_RDX_14;
            }
          }
          else {
            pcVar16 = pcVar15 + 1;
            printOperand(MI,(int)pcVar15[1] - 1,OS);
            pMVar14 = extraout_RDX_13;
          }
        }
        else {
          if (cVar2 == '\0') break;
          SStream_concat(OS,"%c",(ulong)(uint)(int)cVar2);
          pMVar14 = extraout_RDX_12;
          pcVar16 = pcVar15;
        }
        pcVar15 = pcVar16 + 1;
      } while( true );
    }
  }
  if (pcVar17 == (char *)0x0) {
    printInstruction(MI,OS,pMVar14);
  }
  else {
    (*cs_mem_free)(pcVar17);
  }
  if (MI->flat_insn->id == 0x2b9) {
    SStream_Init(OS);
    SStream_concat0(OS,"sysexit");
  }
  if (MI->has_imm == true) {
    pcVar10 = MI->flat_insn->detail;
    if ((pcVar10->field_6).x86.op_count < 2) {
      *(uint8_t *)((long)&pcVar10->field_6 + 0x68) = MI->imm_size;
    }
    else if ((MI->flat_insn->id & 0xfffffffe) != 0x9a) {
      pcVar10 = MI->flat_insn->detail;
      bVar3 = (pcVar10->field_6).x86.op_count;
      uVar12 = (ulong)bVar3;
      if (bVar3 != 0) {
        lVar11 = 0xc0;
        uVar13 = 0;
        do {
          if (*(int *)((long)pcVar10->regs_read + lVar11 + -0x20) == 2) {
            *(uint8_t *)((long)pcVar10->regs_read + lVar11) =
                 pcVar10->groups[(ulong)(uint)((int)uVar12 * 0x30) + 0x45];
          }
          uVar13 = uVar13 + 1;
          pcVar10 = MI->flat_insn->detail;
          uVar12 = (ulong)(pcVar10->field_6).x86.op_count;
          lVar11 = lVar11 + 0x30;
        } while (uVar13 < uVar12);
      }
    }
  }
  if (MI->csh->detail == CS_OPT_OFF) {
    return;
  }
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[0] = '\0';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  uVar6 = MCInst_getOpcode(MI);
  if ((int)uVar6 < 0x9d7) {
    if ((0x35 < uVar6 - 0x916) || ((0x24924900249249U >> ((ulong)(uVar6 - 0x916) & 0x3f) & 1) == 0))
    {
      uVar6 = uVar6 - 0x98f;
      if (0x2d < uVar6) goto LAB_001d5170;
      uVar12 = 0x249249249249;
LAB_001d50c3:
      if ((uVar12 >> ((ulong)uVar6 & 0x3f) & 1) == 0) goto LAB_001d5170;
    }
  }
  else if ((0x2e < uVar6 - 0x9d7) || ((0x492492249249U >> ((ulong)(uVar6 - 0x9d7) & 0x3f) & 1) == 0)
          ) {
    uVar6 = uVar6 - 0xa74;
    if (0x3d < uVar6) goto LAB_001d5170;
    uVar12 = 0x2492490000249249;
    goto LAB_001d50c3;
  }
  pcVar10 = MI->flat_insn->detail;
  memmove((void *)((long)&pcVar10->field_6 + 0x78),(void *)((long)&pcVar10->field_6 + 0x48),0x150);
  (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_IMM;
  paVar4 = &MI->flat_insn->detail->field_6;
  ((cs_m68k_op *)paVar4)[1].mem.out_disp = 1;
  ((cs_m68k_op *)paVar4)[1].mem.disp = 0;
  ((cs_m68k_op *)paVar4)[1].mem.scale = '\0';
  ((cs_m68k_op *)paVar4)[1].mem.bitfield = '\0';
  *(undefined1 *)((long)&MI->flat_insn->detail->field_6 + 0x68) = 1;
  puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
  *puVar1 = *puVar1 + '\x01';
LAB_001d5170:
  uVar6 = MCInst_getOpcode(MI);
  xVar7 = X86_insn_reg_att(uVar6,(cs_ac_type *)local_48);
  local_44 = xVar7;
  if (xVar7 == X86_REG_INVALID) {
    uVar6 = MCInst_getOpcode(MI);
    _Var5 = X86_insn_reg_att2(uVar6,&local_44,(cs_ac_type *)local_48,&local_34,
                              (cs_ac_type *)local_38);
    if (_Var5) {
      (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
      (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = local_44;
      *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x68) = MI->csh->regsize_map[local_44];
      *(undefined1 *)((long)&MI->flat_insn->detail->field_6 + 0x69) = local_48[0];
      (MI->flat_insn->detail->field_6).x86.operands[1].type = X86_OP_REG;
      (MI->flat_insn->detail->field_6).x86.operands[1].field_1.reg = local_34;
      *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x98) = MI->csh->regsize_map[local_34];
      *(undefined1 *)((long)&MI->flat_insn->detail->field_6 + 0x69) = local_38[0];
      (MI->flat_insn->detail->field_6).x86.op_count = '\x02';
    }
  }
  else {
    pcVar10 = MI->flat_insn->detail;
    memmove((void *)((long)&pcVar10->field_6 + 0x78),(void *)((long)&pcVar10->field_6 + 0x48),0x150)
    ;
    (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
    (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = xVar7;
    *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x68) = MI->csh->regsize_map[xVar7];
    *(undefined1 *)((long)&MI->flat_insn->detail->field_6 + 0x69) = local_48[0];
    puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  h = MI->csh;
  uVar6 = MCInst_getOpcode(MI);
  get_op_access(h,uVar6,local_40,&(MI->flat_insn->detail->field_6).x86.field_15.eflags);
  *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x69) = local_40[0];
  *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x99) = local_40[1];
  return;
}

Assistant:

void X86_ATT_printInst(MCInst *MI, SStream *OS, void *info)
{
	char *mnem;
	x86_reg reg, reg2;
	enum cs_ac_type access1, access2;
	int i;

	// perhaps this instruction does not need printer
	if (MI->assembly[0]) {
		strncpy(OS->buffer, MI->assembly, sizeof(OS->buffer));
		return;
	}

	// Output CALLpcrel32 as "callq" in 64-bit mode.
	// In Intel annotation it's always emitted as "call".
	//
	// TODO: Probably this hack should be redesigned via InstAlias in
	// InstrInfo.td as soon as Requires clause is supported properly
	// for InstAlias.
	if (MI->csh->mode == CS_MODE_64 && MCInst_getOpcode(MI) == X86_CALLpcrel32) {
		SStream_concat0(OS, "callq\t");
		MCInst_setOpcodePub(MI, X86_INS_CALL);
		printPCRelImm(MI, 0, OS);
		return;
	}

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, OS, info);
	if (mnem)
		cs_mem_free(mnem);
	else
		printInstruction(MI, OS, info);

	// HACK TODO: fix this in machine description
	switch(MI->flat_insn->id) {
		default: break;
		case X86_INS_SYSEXIT:
				 SStream_Init(OS);
				 SStream_concat0(OS, "sysexit");
				 break;
	}

	if (MI->has_imm) {
		// if op_count > 1, then this operand's size is taken from the destination op
		if (MI->flat_insn->detail->x86.op_count > 1) {
			if (MI->flat_insn->id != X86_INS_LCALL && MI->flat_insn->id != X86_INS_LJMP) {
				for (i = 0; i < MI->flat_insn->detail->x86.op_count; i++) {
					if (MI->flat_insn->detail->x86.operands[i].type == X86_OP_IMM)
						MI->flat_insn->detail->x86.operands[i].size =
							MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count - 1].size;
				}
			}
		} else
			MI->flat_insn->detail->x86.operands[0].size = MI->imm_size;
	}

	if (MI->csh->detail) {
		uint8_t access[6] = {0};

		// some instructions need to supply immediate 1 in the first op
		switch(MCInst_getOpcode(MI)) {
			default:
				break;
			case X86_SHL8r1:
			case X86_SHL16r1:
			case X86_SHL32r1:
			case X86_SHL64r1:
			case X86_SAL8r1:
			case X86_SAL16r1:
			case X86_SAL32r1:
			case X86_SAL64r1:
			case X86_SHR8r1:
			case X86_SHR16r1:
			case X86_SHR32r1:
			case X86_SHR64r1:
			case X86_SAR8r1:
			case X86_SAR16r1:
			case X86_SAR32r1:
			case X86_SAR64r1:
			case X86_RCL8r1:
			case X86_RCL16r1:
			case X86_RCL32r1:
			case X86_RCL64r1:
			case X86_RCR8r1:
			case X86_RCR16r1:
			case X86_RCR32r1:
			case X86_RCR64r1:
			case X86_ROL8r1:
			case X86_ROL16r1:
			case X86_ROL32r1:
			case X86_ROL64r1:
			case X86_ROR8r1:
			case X86_ROR16r1:
			case X86_ROR32r1:
			case X86_ROR64r1:
			case X86_SHL8m1:
			case X86_SHL16m1:
			case X86_SHL32m1:
			case X86_SHL64m1:
			case X86_SAL8m1:
			case X86_SAL16m1:
			case X86_SAL32m1:
			case X86_SAL64m1:
			case X86_SHR8m1:
			case X86_SHR16m1:
			case X86_SHR32m1:
			case X86_SHR64m1:
			case X86_SAR8m1:
			case X86_SAR16m1:
			case X86_SAR32m1:
			case X86_SAR64m1:
			case X86_RCL8m1:
			case X86_RCL16m1:
			case X86_RCL32m1:
			case X86_RCL64m1:
			case X86_RCR8m1:
			case X86_RCR16m1:
			case X86_RCR32m1:
			case X86_RCR64m1:
			case X86_ROL8m1:
			case X86_ROL16m1:
			case X86_ROL32m1:
			case X86_ROL64m1:
			case X86_ROR8m1:
			case X86_ROR16m1:
			case X86_ROR32m1:
			case X86_ROR64m1:
				// shift all the ops right to leave 1st slot for this new register op
				memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
						sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
				MI->flat_insn->detail->x86.operands[0].type = X86_OP_IMM;
				MI->flat_insn->detail->x86.operands[0].imm = 1;
				MI->flat_insn->detail->x86.operands[0].size = 1;
				MI->flat_insn->detail->x86.op_count++;
		}

		// special instruction needs to supply register op
		// first op can be embedded in the asm by llvm.
		// so we have to add the missing register as the first operand

		//printf(">>> opcode = %u\n", MCInst_getOpcode(MI));

		reg = X86_insn_reg_att(MCInst_getOpcode(MI), &access1);
		if (reg) {
			// shift all the ops right to leave 1st slot for this new register op
			memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
					sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
			MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
			MI->flat_insn->detail->x86.operands[0].reg = reg;
			MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.operands[0].access = access1;

			MI->flat_insn->detail->x86.op_count++;
		} else {
			if (X86_insn_reg_att2(MCInst_getOpcode(MI), &reg, &access1, &reg2, &access2)) {

				MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[0].reg = reg;
				MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.operands[0].access = access1;
				MI->flat_insn->detail->x86.operands[1].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[1].reg = reg2;
				MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg2];
				MI->flat_insn->detail->x86.operands[0].access = access2;
				MI->flat_insn->detail->x86.op_count = 2;
			}
		}

#ifndef CAPSTONE_DIET
		get_op_access(MI->csh, MCInst_getOpcode(MI), access, &MI->flat_insn->detail->x86.eflags);
		MI->flat_insn->detail->x86.operands[0].access = access[0];
		MI->flat_insn->detail->x86.operands[1].access = access[1];
#endif
	}
}